

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::resend(Session *this,Message *message)

{
  SendingTime *pSVar1;
  DoNotSend *anon_var_0;
  FieldBase local_b0;
  UtcTimeStamp local_48;
  UtcTimeStampField *local_30;
  SendingTime *sendingTime;
  Header *header;
  Message *message_local;
  Session *this_local;
  
  header = (Header *)message;
  message_local = (Message *)this;
  sendingTime = (SendingTime *)Message::getHeader(message);
  local_30 = &FieldMap::getField<FIX::SendingTime>((FieldMap *)sendingTime)->super_UtcTimeStampField
  ;
  FieldMap::getField<FIX::MsgSeqNum>((FieldMap *)sendingTime);
  pSVar1 = sendingTime;
  UtcTimeStampField::operator_cast_to_UtcTimeStamp(&local_48,local_30);
  insertOrigSendingTime(this,(Header *)pSVar1,&local_48);
  UtcTimeStamp::~UtcTimeStamp(&local_48);
  pSVar1 = sendingTime;
  anon_var_0._7_1_ = 1;
  PossDupFlag::PossDupFlag((PossDupFlag *)&local_b0,(BOOLEAN *)((long)&anon_var_0 + 7));
  FieldMap::setField((FieldMap *)pSVar1,&local_b0,true);
  PossDupFlag::~PossDupFlag((PossDupFlag *)&local_b0);
  insertSendingTime(this,(Header *)sendingTime);
  (**(code **)(*(long *)this->m_application + 0x30))(this->m_application,header,&this->m_sessionID);
  return true;
}

Assistant:

bool Session::resend(Message &message) {
  Header &header = message.getHeader();
  auto const &sendingTime = header.getField<SendingTime>();
  header.getField<MsgSeqNum>();
  insertOrigSendingTime(header, sendingTime);
  header.setField(PossDupFlag(true));
  insertSendingTime(header);

  try {
    m_application.toApp(message, m_sessionID);
    return true;
  } catch (DoNotSend &) {
    return false;
  }
}